

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScannerException.cpp
# Opt level: O2

string * __thiscall
ScannerException::toString_abi_cxx11_(string *__return_storage_ptr__,ScannerException *this)

{
  allocator local_b1;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_70,"line(",&local_b1);
  std::__cxx11::to_string(&local_90,this->line);
  std::operator+(&local_50,&local_70,&local_90);
  std::operator+(&local_30,&local_50,"), ");
  ANTLRException::getMessage_abi_cxx11_(&local_b0,&this->super_ANTLRException);
  std::operator+(__return_storage_ptr__,&local_30,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string ScannerException::toString() const
{
	return std::string("line(")+std::to_string(line)+"), "+getMessage();
}